

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Value * json_parse_string_with_comments(char *string)

{
  char *string_00;
  JSON_Value *pJVar1;
  char *local_18;
  
  string_00 = parson_strdup(string);
  if (string_00 == (char *)0x0) {
    pJVar1 = (JSON_Value *)0x0;
  }
  else {
    remove_comments(string_00,"/*","*/");
    remove_comments(string_00,"//","\n");
    local_18 = string_00;
    pJVar1 = parse_value(&local_18,0);
    (*parson_free)(string_00);
  }
  return pJVar1;
}

Assistant:

JSON_Value * json_parse_string_with_comments(const char *string) {
    JSON_Value *result = NULL;
    char *string_mutable_copy = NULL, *string_mutable_copy_ptr = NULL;
    string_mutable_copy = parson_strdup(string);
    if (string_mutable_copy == NULL) {
        return NULL;
    }
    remove_comments(string_mutable_copy, "/*", "*/");
    remove_comments(string_mutable_copy, "//", "\n");
    string_mutable_copy_ptr = string_mutable_copy;
    result = parse_value((const char**)&string_mutable_copy_ptr, 0);
    parson_free(string_mutable_copy);
    return result;
}